

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

PipelineFor<DynamicStruct> *
capnp::DynamicValue::Pipeline::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
          (PipelineFor<DynamicStruct> *__return_storage_ptr__,Pipeline *pipeline)

{
  Fault f;
  Fault local_10;
  
  if (pipeline->type == STRUCT) {
    (__return_storage_ptr__->schema).super_Schema.raw =
         (pipeline->field_1).structValue.schema.super_Schema.raw;
    (__return_storage_ptr__->typeless).hook.disposer =
         (pipeline->field_1).structValue.typeless.hook.disposer;
    (__return_storage_ptr__->typeless).hook.ptr = (pipeline->field_1).structValue.typeless.hook.ptr;
    (pipeline->field_1).structValue.typeless.hook.ptr = (PipelineHook *)0x0;
    (__return_storage_ptr__->typeless).ops.ptr = (pipeline->field_1).structValue.typeless.ops.ptr;
    (__return_storage_ptr__->typeless).ops.size_ =
         (pipeline->field_1).structValue.typeless.ops.size_;
    (__return_storage_ptr__->typeless).ops.disposer =
         (pipeline->field_1).structValue.typeless.ops.disposer;
    (pipeline->field_1).structValue.typeless.ops.ptr = (PipelineOp *)0x0;
    (pipeline->field_1).structValue.typeless.ops.size_ = 0;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x717,FAILED,"pipeline.type == STRUCT","\"Pipeline type mismatch.\"",
             (char (*) [24])"Pipeline type mismatch.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

PipelineFor<DynamicStruct> DynamicValue::Pipeline::AsImpl<DynamicStruct>::apply(
    Pipeline& pipeline) {
  KJ_REQUIRE(pipeline.type == STRUCT, "Pipeline type mismatch.");
  return kj::mv(pipeline.structValue);
}